

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O0

void __thiscall
Assimp::COBImporter::UnsupportedChunk_Ascii
          (COBImporter *this,LineSplitter *splitter,ChunkInfo *nfo,char *name)

{
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar1;
  basic_formatter *this_00;
  Logger *this_01;
  StreamReaderLE *this_02;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  undefined1 local_48 [8];
  string error;
  char *name_local;
  ChunkInfo *nfo_local;
  LineSplitter *splitter_local;
  COBImporter *this_local;
  
  error.field_2._8_8_ = name;
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[32]>(&local_1c0,(char (*) [32])"Encountered unsupported chunk: ");
  pbVar1 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                     ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                      &local_1c0,(char **)((long)&error.field_2 + 8));
  pbVar1 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                     (pbVar1,(char (*) [12])" [version: ");
  pbVar1 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                     (pbVar1,&nfo->version);
  pbVar1 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                     (pbVar1,(char (*) [9])", size: ");
  pbVar1 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                     (pbVar1,&nfo->size);
  this_00 = (basic_formatter *)
            Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                      (pbVar1,(char (*) [2])0xb544e8);
  Formatter::basic_formatter::operator_cast_to_string((string *)local_48,this_00);
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::~basic_formatter
            (&local_1c0);
  if (nfo->size != 0xffffffff) {
    this_01 = DefaultLogger::get();
    Logger::error(this_01,(string *)local_48);
    this_02 = LineSplitter::get_stream(splitter);
    StreamReader<false,_false>::IncPtr(this_02,(ulong)nfo->size);
    LineSplitter::swallow_next_increment(splitter);
    std::__cxx11::string::~string((string *)local_48);
    return;
  }
  ThrowException((string *)local_48);
}

Assistant:

void COBImporter::UnsupportedChunk_Ascii(LineSplitter& splitter, const ChunkInfo& nfo, const char* name)
{
    const std::string error = format("Encountered unsupported chunk: ") <<  name <<
        " [version: "<<nfo.version<<", size: "<<nfo.size<<"]";

    // we can recover if the chunk size was specified.
    if(nfo.size != static_cast<unsigned int>(-1)) {
        ASSIMP_LOG_ERROR(error);

        // (HACK) - our current position in the stream is the beginning of the
        // head line of the next chunk. That's fine, but the caller is going
        // to call ++ on `splitter`, which we need to swallow to avoid
        // missing the next line.
        splitter.get_stream().IncPtr(nfo.size);
        splitter.swallow_next_increment();
    }
    else ThrowException(error);
}